

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

RenderBatch *
rlLoadRenderBatch(RenderBatch *__return_storage_ptr__,int numBuffers,int bufferElements)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  VertexBuffer *pVVar7;
  float *pfVar8;
  uchar *puVar9;
  uint *puVar10;
  DrawCall *pDVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  __return_storage_ptr__->draws = (DrawCall *)0x0;
  __return_storage_ptr__->drawsCounter = 0;
  __return_storage_ptr__->currentDepth = 0.0;
  __return_storage_ptr__->buffersCount = 0;
  __return_storage_ptr__->currentBuffer = 0;
  __return_storage_ptr__->vertexBuffer = (VertexBuffer *)0x0;
  pVVar7 = (VertexBuffer *)malloc((long)numBuffers * 0x48);
  __return_storage_ptr__->vertexBuffer = pVVar7;
  if (numBuffers < 1) {
    TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
  }
  else {
    uVar3 = bufferElements * 0xc;
    uVar4 = bufferElements * 8;
    uVar5 = bufferElements * 0x10;
    iVar2 = bufferElements * 6;
    uVar15 = (ulong)uVar4;
    if ((int)uVar4 < 2) {
      uVar15 = 1;
    }
    uVar1 = 1;
    if (1 < (int)uVar5) {
      uVar1 = uVar5;
    }
    iVar6 = 6;
    if (6 < iVar2) {
      iVar6 = iVar2;
    }
    uVar16 = 0;
    do {
      pVVar7[uVar16].elementsCount = bufferElements;
      pfVar8 = (float *)malloc((long)(int)uVar3 << 2);
      pVVar7[uVar16].vertices = pfVar8;
      pfVar8 = (float *)malloc((long)(int)uVar4 * 4);
      pVVar7[uVar16].texcoords = pfVar8;
      puVar9 = (uchar *)malloc((long)(int)uVar5);
      pVVar7[uVar16].colors = puVar9;
      puVar10 = (uint *)malloc((long)iVar2 * 4);
      pVVar7[uVar16].indices = puVar10;
      if (0 < (int)uVar3) {
        uVar13 = 0;
        do {
          pVVar7[uVar16].vertices[uVar13] = 0.0;
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
      if (0 < bufferElements) {
        uVar13 = 0;
        do {
          pVVar7[uVar16].texcoords[uVar13] = 0.0;
          uVar13 = uVar13 + 1;
        } while (uVar15 != uVar13);
        if (0 < bufferElements) {
          uVar13 = 0;
          do {
            pVVar7[uVar16].colors[uVar13] = '\0';
            uVar13 = uVar13 + 1;
          } while (uVar1 != uVar13);
          if (0 < bufferElements) {
            uVar12 = 3;
            lVar14 = 0;
            do {
              pVVar7[uVar16].indices[lVar14] = uVar12 - 3;
              pVVar7[uVar16].indices[lVar14 + 1] = uVar12 - 2;
              pVVar7[uVar16].indices[lVar14 + 2] = uVar12 - 1;
              pVVar7[uVar16].indices[lVar14 + 3] = uVar12 - 3;
              pVVar7[uVar16].indices[lVar14 + 4] = uVar12 - 1;
              pVVar7[uVar16].indices[lVar14 + 5] = uVar12;
              lVar14 = lVar14 + 6;
              uVar12 = uVar12 + 4;
            } while ((int)(((ulong)(iVar6 - 2) + 1) / 6) * 6 + 6 != (int)lVar14);
          }
        }
      }
      pVVar7[uVar16].vCounter = 0;
      pVVar7[uVar16].tcCounter = 0;
      pVVar7[uVar16].cCounter = 0;
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)numBuffers);
    TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
    if (0 < numBuffers) {
      lVar14 = 0;
      do {
        if (RLGL.ExtSupported.vao == true) {
          (*glad_glGenVertexArrays)(1,(GLuint *)((long)pVVar7->vboId + lVar14 + -4));
          (*glad_glBindVertexArray)(*(GLuint *)((long)pVVar7->vboId + lVar14 + -4));
        }
        (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar7->vboId + lVar14));
        (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar7->vboId + lVar14));
        (*glad_glBufferData)
                  (0x8892,(long)(bufferElements * 0xc) << 2,
                   *(void **)((long)pVVar7->vboId + lVar14 + -0x24),0x88e8);
        (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShader.locs);
        (*glad_glVertexAttribPointer)(*RLGL.State.currentShader.locs,3,0x1406,'\0',0,(void *)0x0);
        (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar7->vboId + lVar14 + 4));
        (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar7->vboId + lVar14 + 4));
        (*glad_glBufferData)
                  (0x8892,(long)(int)uVar4 * 4,*(void **)((long)pVVar7->vboId + lVar14 + -0x1c),
                   0x88e8);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[1]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[1],2,0x1406,'\0',0,(void *)0x0);
        (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar7->vboId + lVar14 + 8));
        (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar7->vboId + lVar14 + 8));
        (*glad_glBufferData)
                  (0x8892,(long)(int)uVar5,*(void **)((long)pVVar7->vboId + lVar14 + -0x14),0x88e8);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[5]);
        (*glad_glVertexAttribPointer)
                  (RLGL.State.currentShader.locs[5],4,0x1401,'\x01',0,(void *)0x0);
        (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar7->vboId + lVar14 + 0xc));
        (*glad_glBindBuffer)(0x8893,*(GLuint *)((long)pVVar7->vboId + lVar14 + 0xc));
        (*glad_glBufferData)
                  (0x8893,(long)(bufferElements * 6) << 2,
                   *(void **)((long)pVVar7->vboId + lVar14 + -0xc),0x88e4);
        lVar14 = lVar14 + 0x48;
      } while ((ulong)(uint)numBuffers * 0x48 != lVar14);
    }
  }
  TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in VRAM (GPU)");
  if (RLGL.ExtSupported.vao != false) {
    (*glad_glBindVertexArray)(0);
  }
  pDVar11 = (DrawCall *)malloc(0x1000);
  __return_storage_ptr__->draws = pDVar11;
  uVar3 = RLGL.State.defaultTextureId;
  lVar14 = 0;
  do {
    *(undefined8 *)((long)&pDVar11->mode + lVar14) = 7;
    *(undefined4 *)((long)&pDVar11->vertexAlignment + lVar14) = 0;
    *(uint *)((long)&pDVar11->textureId + lVar14) = uVar3;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x1000);
  __return_storage_ptr__->buffersCount = numBuffers;
  __return_storage_ptr__->drawsCounter = 1;
  __return_storage_ptr__->currentDepth = -1.0;
  return __return_storage_ptr__;
}

Assistant:

RenderBatch rlLoadRenderBatch(int numBuffers, int bufferElements)
{
    RenderBatch batch = { 0 };

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Initialize CPU (RAM) vertex buffers (position, texcoord, color data and indexes)
    //--------------------------------------------------------------------------------------------
    batch.vertexBuffer = (VertexBuffer *)RL_MALLOC(sizeof(VertexBuffer)*numBuffers);

    for (int i = 0; i < numBuffers; i++)
    {
        batch.vertexBuffer[i].elementsCount = bufferElements;

        batch.vertexBuffer[i].vertices = (float *)RL_MALLOC(bufferElements*3*4*sizeof(float));        // 3 float by vertex, 4 vertex by quad
        batch.vertexBuffer[i].texcoords = (float *)RL_MALLOC(bufferElements*2*4*sizeof(float));       // 2 float by texcoord, 4 texcoord by quad
        batch.vertexBuffer[i].colors = (unsigned char *)RL_MALLOC(bufferElements*4*4*sizeof(unsigned char));   // 4 float by color, 4 colors by quad
#if defined(GRAPHICS_API_OPENGL_33)
        batch.vertexBuffer[i].indices = (unsigned int *)RL_MALLOC(bufferElements*6*sizeof(unsigned int));      // 6 int by quad (indices)
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
        batch.vertexBuffer[i].indices = (unsigned short *)RL_MALLOC(bufferElements*6*sizeof(unsigned short));  // 6 int by quad (indices)
#endif

        for (int j = 0; j < (3*4*bufferElements); j++) batch.vertexBuffer[i].vertices[j] = 0.0f;
        for (int j = 0; j < (2*4*bufferElements); j++) batch.vertexBuffer[i].texcoords[j] = 0.0f;
        for (int j = 0; j < (4*4*bufferElements); j++) batch.vertexBuffer[i].colors[j] = 0;

        int k = 0;

        // Indices can be initialized right now
        for (int j = 0; j < (6*bufferElements); j += 6)
        {
            batch.vertexBuffer[i].indices[j] = 4*k;
            batch.vertexBuffer[i].indices[j + 1] = 4*k + 1;
            batch.vertexBuffer[i].indices[j + 2] = 4*k + 2;
            batch.vertexBuffer[i].indices[j + 3] = 4*k;
            batch.vertexBuffer[i].indices[j + 4] = 4*k + 2;
            batch.vertexBuffer[i].indices[j + 5] = 4*k + 3;

            k++;
        }

        batch.vertexBuffer[i].vCounter = 0;
        batch.vertexBuffer[i].tcCounter = 0;
        batch.vertexBuffer[i].cCounter = 0;
    }

    TRACELOG(LOG_INFO, "RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
    //--------------------------------------------------------------------------------------------

    // Upload to GPU (VRAM) vertex data and initialize VAOs/VBOs
    //--------------------------------------------------------------------------------------------
    for (int i = 0; i < numBuffers; i++)
    {
        if (RLGL.ExtSupported.vao)
        {
            // Initialize Quads VAO
            glGenVertexArrays(1, &batch.vertexBuffer[i].vaoId);
            glBindVertexArray(batch.vertexBuffer[i].vaoId);
        }

        // Quads - Vertex buffers binding and attributes enable
        // Vertex position buffer (shader-location = 0)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[0]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[0]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*3*4*sizeof(float), batch.vertexBuffer[i].vertices, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);

        // Vertex texcoord buffer (shader-location = 1)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[1]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[1]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*2*4*sizeof(float), batch.vertexBuffer[i].texcoords, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);

        // Vertex color buffer (shader-location = 3)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[2]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[2]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*4*4*sizeof(unsigned char), batch.vertexBuffer[i].colors, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);

        // Fill index buffer
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[3]);
        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[3]);
#if defined(GRAPHICS_API_OPENGL_33)
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, bufferElements*6*sizeof(int), batch.vertexBuffer[i].indices, GL_STATIC_DRAW);
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, bufferElements*6*sizeof(short), batch.vertexBuffer[i].indices, GL_STATIC_DRAW);
#endif
    }

    TRACELOG(LOG_INFO, "RLGL: Render batch vertex buffers loaded successfully in VRAM (GPU)");

    // Unbind the current VAO
    if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    //--------------------------------------------------------------------------------------------

    // Init draw calls tracking system
    //--------------------------------------------------------------------------------------------
    batch.draws = (DrawCall *)RL_MALLOC(DEFAULT_BATCH_DRAWCALLS*sizeof(DrawCall));

    for (int i = 0; i < DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch.draws[i].mode = RL_QUADS;
        batch.draws[i].vertexCount = 0;
        batch.draws[i].vertexAlignment = 0;
        //batch.draws[i].vaoId = 0;
        //batch.draws[i].shaderId = 0;
        batch.draws[i].textureId = RLGL.State.defaultTextureId;
        //batch.draws[i].RLGL.State.projection = MatrixIdentity();
        //batch.draws[i].RLGL.State.modelview = MatrixIdentity();
    }

    batch.buffersCount = numBuffers;    // Record buffer count
    batch.drawsCounter = 1;             // Reset draws counter
    batch.currentDepth = -1.0f;         // Reset depth value
    //--------------------------------------------------------------------------------------------
#endif

    return batch;
}